

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int file_new(archive_write *a,archive_entry *entry,file **newfile)

{
  wchar_t wVar1;
  mode_t mVar2;
  archive_entry *entry_00;
  int *piVar3;
  void *pvVar4;
  int64_t iVar5;
  char *__s;
  size_t sVar6;
  time_t tVar7;
  long lVar8;
  undefined8 *in_RDX;
  archive_entry *in_RSI;
  archive *in_RDI;
  int ret;
  size_t u16len;
  char *u16;
  file *file;
  _7zip_conflict *zip;
  undefined4 in_stack_ffffffffffffffb8;
  size_t *in_stack_ffffffffffffffc0;
  char **in_stack_ffffffffffffffc8;
  int local_4;
  
  local_4 = 0;
  *in_RDX = 0;
  entry_00 = (archive_entry *)calloc(1,0x80);
  if (entry_00 == (archive_entry *)0x0) {
    archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
    local_4 = -0x1e;
  }
  else {
    wVar1 = _archive_entry_pathname_l
                      (entry_00,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                       (archive_string_conv *)CONCAT44(local_4,in_stack_ffffffffffffffb8));
    if (wVar1 < L'\0') {
      piVar3 = __errno_location();
      if (*piVar3 == 0xc) {
        free(entry_00);
        archive_set_error(in_RDI,0xc,"Can\'t allocate memory for UTF-16LE");
        return -0x1e;
      }
      archive_set_error(in_RDI,-1,
                        "A filename cannot be converted to UTF-16LE;You should disable making Joliet extension"
                       );
      local_4 = -0x14;
    }
    pvVar4 = malloc((long)in_stack_ffffffffffffffc0 + 2);
    (entry_00->ae_stat).aest_ctime = (int64_t)pvVar4;
    if ((entry_00->ae_stat).aest_ctime == 0) {
      free(entry_00);
      archive_set_error(in_RDI,0xc,"Can\'t allocate memory for Name");
      local_4 = -0x1e;
    }
    else {
      memcpy((void *)(entry_00->ae_stat).aest_ctime,in_stack_ffffffffffffffc8,
             (size_t)in_stack_ffffffffffffffc0);
      *(undefined1 *)((entry_00->ae_stat).aest_ctime + (long)in_stack_ffffffffffffffc0) = 0;
      *(undefined1 *)((entry_00->ae_stat).aest_ctime + 1 + (long)in_stack_ffffffffffffffc0) = 0;
      (entry_00->ae_stat).aest_atime_nsec = (uint32_t)in_stack_ffffffffffffffc0;
      mVar2 = archive_entry_mode(in_RSI);
      *(mode_t *)&(entry_00->ae_stat).aest_size = mVar2;
      mVar2 = archive_entry_filetype(in_RSI);
      if (mVar2 == 0x8000) {
        iVar5 = archive_entry_size(in_RSI);
        *(int64_t *)&(entry_00->ae_stat).aest_ctime_nsec = iVar5;
      }
      else {
        archive_entry_set_size(in_RSI,0);
      }
      mVar2 = archive_entry_filetype(in_RSI);
      if (mVar2 == 0x4000) {
        *(byte *)&(entry_00->ae_stat).aest_uid = (byte)(entry_00->ae_stat).aest_uid & 0xfe | 1;
      }
      else {
        mVar2 = archive_entry_filetype(in_RSI);
        if (mVar2 == 0xa000) {
          __s = archive_entry_symlink((archive_entry *)CONCAT44(local_4,in_stack_ffffffffffffffb8));
          sVar6 = strlen(__s);
          *(size_t *)&(entry_00->ae_stat).aest_ctime_nsec = sVar6;
        }
      }
      wVar1 = archive_entry_mtime_is_set(in_RSI);
      if (wVar1 != L'\0') {
        *(uint *)&(entry_00->ae_stat).aest_mtime = (uint)(entry_00->ae_stat).aest_mtime | 1;
        tVar7 = archive_entry_mtime(in_RSI);
        *(time_t *)&(entry_00->ae_stat).aest_mtime_nsec = tVar7;
        lVar8 = archive_entry_mtime_nsec(in_RSI);
        (entry_00->ae_stat).aest_birthtime = lVar8;
      }
      wVar1 = archive_entry_atime_is_set(in_RSI);
      if (wVar1 != L'\0') {
        *(uint *)&(entry_00->ae_stat).aest_mtime = (uint)(entry_00->ae_stat).aest_mtime | 2;
        tVar7 = archive_entry_atime(in_RSI);
        *(time_t *)&(entry_00->ae_stat).aest_birthtime_nsec = tVar7;
        lVar8 = archive_entry_atime_nsec(in_RSI);
        (entry_00->ae_stat).aest_gid = lVar8;
      }
      wVar1 = archive_entry_ctime_is_set(in_RSI);
      if (wVar1 != L'\0') {
        *(uint *)&(entry_00->ae_stat).aest_mtime = (uint)(entry_00->ae_stat).aest_mtime | 4;
        tVar7 = archive_entry_ctime(in_RSI);
        (entry_00->ae_stat).aest_ino = tVar7;
        lVar8 = archive_entry_ctime_nsec(in_RSI);
        *(long *)&(entry_00->ae_stat).aest_nlink = lVar8;
      }
      *in_RDX = entry_00;
    }
  }
  return local_4;
}

Assistant:

static int
file_new(struct archive_write *a, struct archive_entry *entry,
    struct file **newfile)
{
	struct _7zip *zip;
	struct file *file;
	const char *u16;
	size_t u16len;
	int ret = ARCHIVE_OK;

	zip = (struct _7zip *)a->format_data;
	*newfile = NULL;

	file = calloc(1, sizeof(*file));
	if (file == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}

	if (0 > archive_entry_pathname_l(entry, &u16, &u16len, zip->sconv)) {
		if (errno == ENOMEM) {
			free(file);
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for UTF-16LE");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "A filename cannot be converted to UTF-16LE;"
		    "You should disable making Joliet extension");
		ret = ARCHIVE_WARN;
	}
	file->utf16name = malloc(u16len + 2);
	if (file->utf16name == NULL) {
		free(file);
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for Name");
		return (ARCHIVE_FATAL);
	}
	memcpy(file->utf16name, u16, u16len);
	file->utf16name[u16len+0] = 0;
	file->utf16name[u16len+1] = 0;
	file->name_len = (unsigned)u16len;
	file->mode = archive_entry_mode(entry);
	if (archive_entry_filetype(entry) == AE_IFREG)
		file->size = archive_entry_size(entry);
	else
		archive_entry_set_size(entry, 0);
	if (archive_entry_filetype(entry) == AE_IFDIR)
		file->dir = 1;
	else if (archive_entry_filetype(entry) == AE_IFLNK)
		file->size = strlen(archive_entry_symlink(entry));
	if (archive_entry_mtime_is_set(entry)) {
		file->flg |= MTIME_IS_SET;
		file->times[MTIME].time = archive_entry_mtime(entry);
		file->times[MTIME].time_ns = archive_entry_mtime_nsec(entry);
	}
	if (archive_entry_atime_is_set(entry)) {
		file->flg |= ATIME_IS_SET;
		file->times[ATIME].time = archive_entry_atime(entry);
		file->times[ATIME].time_ns = archive_entry_atime_nsec(entry);
	}
	if (archive_entry_ctime_is_set(entry)) {
		file->flg |= CTIME_IS_SET;
		file->times[CTIME].time = archive_entry_ctime(entry);
		file->times[CTIME].time_ns = archive_entry_ctime_nsec(entry);
	}

	*newfile = file;
	return (ret);
}